

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O2

void __thiscall leveldb::FileMetaData::~FileMetaData(FileMetaData *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::~string((string *)&this->largest);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::~string((string *)&this->smallest);
    return;
  }
  __stack_chk_fail();
}

Assistant:

FileMetaData() : refs(0), allowed_seeks(1 << 30), file_size(0) {}